

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldStateTest_MergeFromRepeatedDirty_Test::
~MapFieldStateTest_MergeFromRepeatedDirty_Test(MapFieldStateTest_MergeFromRepeatedDirty_Test *this)

{
  MapFieldStateTest_MergeFromRepeatedDirty_Test *this_local;
  
  ~MapFieldStateTest_MergeFromRepeatedDirty_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_P(MapFieldStateTest, MergeFromRepeatedDirty) {
  ArenaHolder<MapFieldType> other(arena_.get());
  MakeRepeatedDirty(other.get());

  map_field_->MergeFrom(*other);

  if (state_ != MAP_DIRTY) {
    Expect(map_field_.get(), MAP_DIRTY, 1, 1);
  } else {
    Expect(map_field_.get(), MAP_DIRTY, 1, 0);
  }

  Expect(other.get(), CLEAN, 1, 1);
}